

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

PrefixUnaryExpressionSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::PrefixUnaryExpressionSyntax,slang::syntax::SyntaxKind&,slang::parsing::Token&,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>const&,slang::syntax::ExpressionSyntax&>
          (BumpAllocator *this,SyntaxKind *args,Token *args_1,
          SyntaxList<slang::syntax::AttributeInstanceSyntax> *args_2,ExpressionSyntax *args_3)

{
  SyntaxKind SVar1;
  size_type sVar2;
  pointer ppAVar3;
  Info *pIVar4;
  TokenKind TVar5;
  undefined1 uVar6;
  NumericTokenFlags NVar7;
  uint32_t uVar8;
  undefined4 uVar9;
  PrefixUnaryExpressionSyntax *pPVar10;
  long lVar11;
  
  pPVar10 = (PrefixUnaryExpressionSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((PrefixUnaryExpressionSyntax *)this->endPtr < pPVar10 + 1) {
    pPVar10 = (PrefixUnaryExpressionSyntax *)allocateSlow(this,0x58,8);
  }
  else {
    this->head->current = (byte *)(pPVar10 + 1);
  }
  SVar1 = *args;
  TVar5 = args_1->kind;
  uVar6 = args_1->field_0x2;
  NVar7.raw = (args_1->numFlags).raw;
  uVar8 = args_1->rawLen;
  pIVar4 = args_1->info;
  (pPVar10->super_ExpressionSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (pPVar10->super_ExpressionSyntax).super_SyntaxNode.kind = SVar1;
  (pPVar10->operatorToken).kind = TVar5;
  (pPVar10->operatorToken).field_0x2 = uVar6;
  (pPVar10->operatorToken).numFlags = (NumericTokenFlags)NVar7.raw;
  (pPVar10->operatorToken).rawLen = uVar8;
  (pPVar10->operatorToken).info = pIVar4;
  SVar1 = (args_2->super_SyntaxListBase).super_SyntaxNode.kind;
  uVar9 = *(undefined4 *)&(args_2->super_SyntaxListBase).super_SyntaxNode.field_0xc;
  (pPVar10->attributes).super_SyntaxListBase.super_SyntaxNode.parent =
       (args_2->super_SyntaxListBase).super_SyntaxNode.parent;
  (pPVar10->attributes).super_SyntaxListBase.super_SyntaxNode.kind = SVar1;
  *(undefined4 *)&(pPVar10->attributes).super_SyntaxListBase.super_SyntaxNode.field_0xc = uVar9;
  (pPVar10->attributes).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_00507f08;
  (pPVar10->attributes).super_SyntaxListBase.childCount = (args_2->super_SyntaxListBase).childCount;
  sVar2 = (args_2->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>).
          size_;
  (pPVar10->attributes).super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>
  .data_ = (args_2->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>).
           data_;
  (pPVar10->attributes).super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>
  .size_ = sVar2;
  (pPVar10->attributes).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_00508348;
  (pPVar10->operand).ptr = args_3;
  (pPVar10->attributes).super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)pPVar10;
  sVar2 = (pPVar10->attributes).
          super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.size_;
  if (sVar2 != 0) {
    ppAVar3 = (pPVar10->attributes).
              super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.data_;
    lVar11 = 0;
    do {
      **(undefined8 **)((long)ppAVar3 + lVar11) = pPVar10;
      lVar11 = lVar11 + 8;
    } while (sVar2 << 3 != lVar11);
  }
  (args_3->super_SyntaxNode).parent = (SyntaxNode *)pPVar10;
  return pPVar10;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }